

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

void __thiscall tokenizer::read_symbol(tokenizer *this)

{
  string *__k;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var1;
  iterator iVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  mapped_type type;
  initializer_list<char> __l;
  allocator_type local_41;
  vector<char,_std::allocator<char>_> symbols;
  char local_28 [16];
  
  builtin_strncpy(local_28,"+-*/%<>=!&|",0xb);
  __l._M_len = 0xb;
  __l._M_array = local_28;
  std::vector<char,_std::allocator<char>_>::vector(&symbols,__l,&local_41);
  pcVar4 = this->line_char;
  this->last_line_number = this->line_number;
  this->last_position_number = this->position_number;
  __k = &this->current_word;
  while (*pcVar4 != '\0') {
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (symbols.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       symbols.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    if (_Var1._M_current ==
        symbols.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__k,*this->line_char);
    pcVar4 = this->line_char + 1;
    this->line_char = pcVar4;
    this->position_number = this->position_number + 1;
  }
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type>_>_>
          ::find(&(this->symbol_to_type)._M_t,__k);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->keyword_to_token_type)._M_t._M_impl.super__Rb_tree_header) {
    type = invalid;
  }
  else {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type>_>_>
             ::operator[](&this->symbol_to_type,__k);
    type = *pmVar3;
  }
  add_token_to_stream(this,type);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign(__k,"");
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&symbols.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void tokenizer::read_symbol() {
    vector<char> symbols = {'+', '-', '*', '/', '%', '<', '>', '=', '!', '&', '|'};

    last_line_number = line_number;
    last_position_number = position_number;

    while(*line_char != '\0') {
        if(find(symbols.begin(), symbols.end(), *line_char) != symbols.end()) {
            current_word += *line_char;
            this->advance_to_next_character();
        }
        else {
            break;
        }
    }

    if(symbol_to_type.find(current_word) == keyword_to_token_type.end()) {
        this->add_token_to_stream(Token_Type::invalid);
    }
    else {
        this->add_token_to_stream(symbol_to_type[current_word]);
    }

    //position_number += current_word.length();
    current_word = "";
}